

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mul-mat2.c
# Opt level: O2

void quantize_6_row(float *src,void *dst,int k)

{
  undefined8 *puVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  float fVar14;
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  uint8_t pp [16];
  __m256 asrcv [4];
  __m256 srcv [4];
  undefined8 local_150;
  undefined8 uStack_148;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  float afStack_c0 [2];
  undefined8 uStack_b8;
  float afStack_b0 [2];
  undefined8 auStack_a8 [20];
  
  if ((k & 0x1fU) != 0) {
    __assert_fail("k % 32 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat2.c"
                  ,0x7e2,"void quantize_6_row(const float *restrict, void *restrict, int)");
  }
  uVar9 = k >> 5;
  uVar10 = 0;
  uVar8 = (ulong)uVar9;
  if ((int)uVar9 < 1) {
    uVar8 = uVar10;
  }
  auVar12._8_4_ = 8;
  auVar12._0_8_ = 0x800000008;
  auVar12._12_4_ = 8;
  auVar12._16_4_ = 8;
  auVar12._20_4_ = 8;
  auVar12._24_4_ = 8;
  auVar12._28_4_ = 8;
  auVar13._8_4_ = 0x7fffffff;
  auVar13._0_8_ = 0x7fffffff7fffffff;
  auVar13._12_4_ = 0x7fffffff;
  auVar13._16_4_ = 0x7fffffff;
  auVar13._20_4_ = 0x7fffffff;
  auVar13._24_4_ = 0x7fffffff;
  auVar13._28_4_ = 0x7fffffff;
  do {
    if (uVar10 == uVar8) {
      return;
    }
    local_150 = 0;
    uStack_148 = 0;
    for (lVar11 = 0; lVar11 != 0x80; lVar11 = lVar11 + 0x20) {
      puVar1 = (undefined8 *)((long)src + lVar11);
      uVar5 = puVar1[1];
      uVar6 = puVar1[2];
      uVar7 = puVar1[3];
      *(undefined8 *)((long)afStack_c0 + lVar11) = *puVar1;
      *(undefined8 *)((long)&uStack_b8 + lVar11) = uVar5;
      *(undefined8 *)((long)auStack_a8 + lVar11 + -8) = uVar6;
      *(undefined8 *)((long)auStack_a8 + lVar11) = uVar7;
    }
    for (lVar11 = 0; lVar11 != 0x80; lVar11 = lVar11 + 0x20) {
      auVar2 = vandps_avx(auVar13,*(undefined1 (*) [32])((long)afStack_c0 + lVar11));
      *(undefined1 (*) [32])(local_140 + lVar11) = auVar2;
    }
    auVar2 = vmaxps_avx(local_100,local_e0);
    auVar4 = vmaxps_avx(local_140,local_120);
    auVar2 = vmaxps_avx(auVar4,auVar2);
    auVar3 = vmaxps_avx(auVar2._0_16_,auVar2._16_16_);
    auVar16 = vshufpd_avx(auVar3,auVar3,5);
    auVar3 = vmaxps_avx(auVar3,auVar16);
    auVar16 = vmovshdup_avx(auVar3);
    auVar3 = vmaxss_avx(auVar3,auVar16);
    auVar16._0_4_ = auVar3._0_4_ / 7.0;
    auVar16._4_12_ = auVar3._4_12_;
    auVar3 = vcmpss_avx(auVar16,ZEXT816(0) << 0x40,4);
    auVar3 = vandps_avx(auVar3,ZEXT416((uint)(1.0 / auVar16._0_4_)));
    *(float *)((long)dst + uVar10 * 4) = auVar16._0_4_;
    fVar14 = auVar3._0_4_;
    lVar11 = 0;
    while (lVar11 != 0x10) {
      auVar15._0_4_ = fVar14 * afStack_c0[lVar11 * 2];
      auVar15._4_4_ = fVar14 * afStack_c0[lVar11 * 2 + 1];
      auVar15._8_4_ = fVar14 * *(float *)(&uStack_b8 + lVar11);
      auVar15._12_4_ = fVar14 * *(float *)((long)&uStack_b8 + lVar11 * 8 + 4);
      auVar15._16_4_ = fVar14 * *(float *)(auStack_a8 + lVar11 + -1);
      auVar15._20_4_ = fVar14 * *(float *)((long)auStack_a8 + lVar11 * 8 + -4);
      auVar15._28_36_ = SUB4836((undefined1  [48])0x0,0xc);
      auVar15._24_4_ = fVar14 * *(float *)(auStack_a8 + lVar11);
      auVar2 = vcvtps2dq_avx(auVar15._0_32_);
      auVar2 = vpaddd_avx2(auVar2,auVar12);
      auVar3 = vshufps_avx(auVar2._0_16_,auVar2._16_16_,0xdd);
      auVar16 = vpslld_avx(auVar3,4);
      auVar3 = vshufps_avx(auVar2._0_16_,auVar2._16_16_,0x88);
      auVar3 = vpshufb_avx(auVar3,SUB6416(ZEXT464(0xc080400),0));
      auVar16 = vpshufb_avx(auVar16,SUB6416(ZEXT464(0xc080400),0));
      auVar3 = vpor_avx(auVar16,auVar3);
      *(int *)((long)&local_150 + lVar11) = auVar3._0_4_;
      if (0xf < auVar2._0_4_) {
        __assert_fail("vi_0 >= 0 && vi_0 < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat2.c"
                      ,0x830,"void quantize_6_row(const float *restrict, void *restrict, int)");
      }
      if (0xf < auVar2._4_4_) {
        __assert_fail("vi_1 >= 0 && vi_1 < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat2.c"
                      ,0x831,"void quantize_6_row(const float *restrict, void *restrict, int)");
      }
      if (0xf < auVar2._8_4_) {
        __assert_fail("vi_2 >= 0 && vi_2 < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat2.c"
                      ,0x832,"void quantize_6_row(const float *restrict, void *restrict, int)");
      }
      if (0xf < auVar2._12_4_) {
        __assert_fail("vi_3 >= 0 && vi_3 < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat2.c"
                      ,0x833,"void quantize_6_row(const float *restrict, void *restrict, int)");
      }
      if (0xf < auVar2._16_4_) {
        __assert_fail("vi_4 >= 0 && vi_4 < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat2.c"
                      ,0x835,"void quantize_6_row(const float *restrict, void *restrict, int)");
      }
      if (0xf < auVar2._20_4_) {
        __assert_fail("vi_5 >= 0 && vi_5 < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat2.c"
                      ,0x836,"void quantize_6_row(const float *restrict, void *restrict, int)");
      }
      if (0xf < auVar2._24_4_) {
        __assert_fail("vi_6 >= 0 && vi_6 < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat2.c"
                      ,0x837,"void quantize_6_row(const float *restrict, void *restrict, int)");
      }
      lVar11 = lVar11 + 4;
      if (0xf < auVar2._28_4_) {
        __assert_fail("vi_7 >= 0 && vi_7 < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat2.c"
                      ,0x838,"void quantize_6_row(const float *restrict, void *restrict, int)");
      }
    }
    puVar1 = (undefined8 *)((long)dst + uVar10 * 0x10 + (long)(int)uVar9 * 4);
    *puVar1 = local_150;
    puVar1[1] = uStack_148;
    uVar10 = uVar10 + 1;
    src = src + 0x20;
  } while( true );
}

Assistant:

void quantize_6_row(const float * restrict src, void * restrict dst, int k) {
    assert(k % 32 == 0);
    assert(QB == 4);

    const int nb = quantize_6_blocks_per_row(k);

    gq_scale_t * restrict pd = (gq_scale_t *) (dst);
    uint8_t    * restrict pb = (uint8_t *)    (pd + nb);

    uint8_t pp[16];

    for (int i = 0; i < nb; i++) {
        memset(pp, 0, sizeof(pp));

        float amax = 0.0f; // absolute max

#if defined(__AVX2__)
        {
            enum { QK8 = 4 };

            __m256 srcv [QK8];
            __m256 asrcv[QK8];
            __m256 amaxv[QK8];

            for (int l = 0; l < QK8; l++) {
                srcv[l]  = _mm256_loadu_ps(src + i*32 + 8*l);
            }

            for (int l = 0; l < QK8; l++) {
                asrcv[l] = _mm256_and_ps(srcv[l], _mm256_castsi256_ps(_mm256_set1_epi32(0x7fffffff)));
            }

            for (int l = 0; l < QK8/2; l++) {
                amaxv[2*l] = _mm256_max_ps(asrcv[2*l], asrcv[2*l+1]);
            }

            for (int l = 0; l < QK8/4; l++) {
                amaxv[4*l] = _mm256_max_ps(amaxv[4*l], amaxv[4*l+2]);
            }

            const __m256 amaxv0_0 = _mm256_permute2f128_ps(amaxv[0], amaxv[0], 3);
            const __m256 amaxv0_1 = _mm256_max_ps(amaxv[0], amaxv0_0);
            const __m256 amaxv0_2 = _mm256_permute_ps(amaxv0_1, 0x4e);
            const __m256 amaxv0_3 = _mm256_max_ps(amaxv0_1, amaxv0_2);
            const __m256 amaxv0_4 = _mm256_permute_ps(amaxv0_3, 0xb1);
            const __m256 amaxv0_5 = _mm256_max_ps(amaxv0_3, amaxv0_4);

            amax = _mm256_cvtss_f32(amaxv0_5);

            const float d = amax / ((1 << (QB - 1)) - 1);
            const float id = d ? 1.0/d : 0.0;

            pd[i] = GGML_FP32_TO_GQ(d);

            const __m256 idv = _mm256_set1_ps(id);

            for (int l = 0; l < 4; l++) {
                __m256 v = _mm256_mul_ps(srcv[l], idv);

                // convert to int8
                __m256i vi = _mm256_cvtps_epi32(v);
                vi = _mm256_add_epi32(vi, _mm256_set1_epi32(8));

                int32_t vi_0 = _mm256_extract_epi32(vi, 0);
                int32_t vi_1 = _mm256_extract_epi32(vi, 1);
                int32_t vi_2 = _mm256_extract_epi32(vi, 2);
                int32_t vi_3 = _mm256_extract_epi32(vi, 3);

                int32_t vi_4 = _mm256_extract_epi32(vi, 4);
                int32_t vi_5 = _mm256_extract_epi32(vi, 5);
                int32_t vi_6 = _mm256_extract_epi32(vi, 6);
                int32_t vi_7 = _mm256_extract_epi32(vi, 7);

                // convert to 4-bit, 2 consecutive packed into 1 byte
                pp[4*l + 0] = vi_0 | (vi_1 << 4);
                pp[4*l + 1] = vi_2 | (vi_3 << 4);
                pp[4*l + 2] = vi_4 | (vi_5 << 4);
                pp[4*l + 3] = vi_6 | (vi_7 << 4);

                assert(vi_0 >= 0 && vi_0 < 16);
                assert(vi_1 >= 0 && vi_1 < 16);
                assert(vi_2 >= 0 && vi_2 < 16);
                assert(vi_3 >= 0 && vi_3 < 16);

                assert(vi_4 >= 0 && vi_4 < 16);
                assert(vi_5 >= 0 && vi_5 < 16);
                assert(vi_6 >= 0 && vi_6 < 16);
                assert(vi_7 >= 0 && vi_7 < 16);
            }

            memcpy(pb + i*16, pp, sizeof(pp));
        }
#elif defined(__ARM_NEON)
        {
            float32x4_t srcv [8];
            float32x4_t asrcv[8];
            float32x4_t amaxv[8];

            for (int l = 0; l < 8; l++) srcv[l]  = vld1q_f32(src + i*32 + 4*l);
            for (int l = 0; l < 8; l++) asrcv[l] = vabsq_f32(srcv[l]);

            for (int l = 0; l < 4; l++) amaxv[2*l] = vmaxq_f32(asrcv[2*l], asrcv[2*l+1]);
            for (int l = 0; l < 2; l++) amaxv[4*l] = vmaxq_f32(amaxv[4*l], amaxv[4*l+2]);
            for (int l = 0; l < 1; l++) amaxv[8*l] = vmaxq_f32(amaxv[8*l], amaxv[8*l+4]);

            amax = MAX(
                    MAX(vgetq_lane_f32(amaxv[0], 0), vgetq_lane_f32(amaxv[0], 1)),
                    MAX(vgetq_lane_f32(amaxv[0], 2), vgetq_lane_f32(amaxv[0], 3)));

            const float d = amax / ((1 << 3) - 1);
            const float id = d ? 1.0/d : 0.0;

            pd[i] = GGML_FP32_TO_GQ(d);

            for (int l = 0; l < 8; l++) {
                const float32x4_t v = vmulq_n_f32(srcv[l], id);
                const float32x4_t vf = vaddq_f32(v, vdupq_n_f32(8.5f));
                const int32x4_t vi = vcvtq_s32_f32(vf);

                pp[2*l + 0] = vgetq_lane_s32(vi, 0) | (vgetq_lane_s32(vi, 1) << 4);
                pp[2*l + 1] = vgetq_lane_s32(vi, 2) | (vgetq_lane_s32(vi, 3) << 4);
            }

            memcpy(pb + i*16, pp, sizeof(pp));
        }
#else
        {
            for (int l = 0; l < 32; l++) {
                const float v = src[i*32 + l];
                amax = MAX(amax, fabsf(v));
            }

            const float d = amax / ((1 << (QB - 1)) - 1);
            const float id = d ? 1.0/d : 0.0;

            pd[i] = GGML_FP32_TO_GQ(d);

            for (int l = 0; l < 32; l++) {
                const float v = src[i*32 + l]*id;
                const int8_t vi = ((int8_t) (round(v))) + 8;
                assert(vi >= 0 && vi < 16);
                pp[l/2] |= (vi & 0xf) << (4*(l & 1));
            }

            memcpy(pb + i*16, pp, sizeof(pp));
        }
#endif
        //printf("amax = %f\n", amax);
    }
}